

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr_test.cpp
# Opt level: O2

void __thiscall shared_ptr_stat_pointer_cast_Test::TestBody(shared_ptr_stat_pointer_cast_Test *this)

{
  shared_ptr_base sVar1;
  A *pAVar2;
  B *p;
  _func_int **pp_Var3;
  char *pcVar4;
  long in_FS_OFFSET;
  bool bVar5;
  shared_ptr<A> local_98;
  AssertHelper local_88;
  AssertionResult gtest_ar_18;
  AssertHelper local_70;
  shared_ptr<A> a2Ptr;
  shared_ptr<B> bPtr;
  shared_ptr<A> abPtr;
  AssertionResult gtest_ar;
  shared_ptr<A> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  local_28.px = (A *)0x0;
  abPtr.super_shared_ptr_base.pn.pn =
       (shared_ptr_count)((ulong)abPtr.super_shared_ptr_base.pn.pn & 0xffffffffffffff00);
  testing::internal::CmpHelperEQ<bool,shared_ptr<A>>
            ((internal *)&gtest_ar,"false","a0Ptr",(bool *)&abPtr,&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&abPtr);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&bPtr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x215,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&bPtr,(Message *)&abPtr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bPtr);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&abPtr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  pAVar2 = (A *)operator_new(8);
  pAVar2->_vptr_A = (_func_int **)&PTR__A_00183f50;
  A::_mNbInstances = A::_mNbInstances + 1;
  shared_ptr<A>::shared_ptr((shared_ptr<A> *)&gtest_ar,pAVar2);
  bPtr.super_shared_ptr_base.pn.pn._0_1_ = 1;
  testing::internal::CmpHelperEQ<bool,shared_ptr<A>>
            ((internal *)&abPtr,"true","aPtr",(bool *)&bPtr,(shared_ptr<A> *)&gtest_ar);
  if ((char)abPtr.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&bPtr);
    if (abPtr.px == (A *)0x0) {
      pp_Var3 = (_func_int **)0x16a6ae;
    }
    else {
      pp_Var3 = (abPtr.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&a2Ptr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x219,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&a2Ptr,(Message *)&bPtr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&a2Ptr);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&bPtr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&abPtr.px);
  bPtr.super_shared_ptr_base.pn.pn._0_1_ = 1;
  if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) == (long *)0x0) {
    bVar5 = false;
  }
  else {
    bVar5 = *(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) == 1;
  }
  a2Ptr.super_shared_ptr_base.pn.pn._0_1_ = bVar5;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&abPtr,"true","aPtr.unique()",(bool *)&bPtr,(bool *)&a2Ptr);
  if ((char)abPtr.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&bPtr);
    if (abPtr.px == (A *)0x0) {
      pp_Var3 = (_func_int **)0x16a6ae;
    }
    else {
      pp_Var3 = (abPtr.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&a2Ptr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x21a,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&a2Ptr,(Message *)&bPtr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&a2Ptr);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&bPtr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&abPtr.px);
  a2Ptr.super_shared_ptr_base.pn.pn._0_4_ = 1;
  if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) == (undefined8 *)0x0) {
    bPtr.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  }
  else {
    bPtr.super_shared_ptr_base.pn.pn =
         *(shared_ptr_count *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
  }
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&abPtr,"1","aPtr.use_count()",(int *)&a2Ptr,(long *)&bPtr);
  if ((char)abPtr.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&bPtr);
    if (abPtr.px == (A *)0x0) {
      pp_Var3 = (_func_int **)0x16a6ae;
    }
    else {
      pp_Var3 = (abPtr.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&a2Ptr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x21b,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&a2Ptr,(Message *)&bPtr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&a2Ptr);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&bPtr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&abPtr.px);
  bPtr.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  a2Ptr.super_shared_ptr_base.pn.pn = (shared_ptr_count)(shared_ptr_count)gtest_ar.message_.ptr_;
  testing::internal::CmpHelperNE<void*,A*>
            ((internal *)&abPtr,"(void*)__null","aPtr.get()",(void **)&bPtr,(A **)&a2Ptr);
  if ((char)abPtr.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&bPtr);
    if (abPtr.px == (A *)0x0) {
      pp_Var3 = (_func_int **)0x16a6ae;
    }
    else {
      pp_Var3 = (abPtr.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&a2Ptr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x21c,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&a2Ptr,(Message *)&bPtr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&a2Ptr);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&bPtr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&abPtr.px);
  bPtr.super_shared_ptr_base.pn.pn._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&abPtr,"1","A::_mNbInstances",(int *)&bPtr,&A::_mNbInstances);
  if ((char)abPtr.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&bPtr);
    if (abPtr.px == (A *)0x0) {
      pp_Var3 = (_func_int **)0x16a6ae;
    }
    else {
      pp_Var3 = (abPtr.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&a2Ptr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x21d,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&a2Ptr,(Message *)&bPtr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&a2Ptr);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&bPtr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&abPtr.px);
  pAVar2 = (A *)operator_new(8);
  A::_mNbInstances = A::_mNbInstances + 1;
  pAVar2->_vptr_A = (_func_int **)&PTR__B_00183f08;
  B::_mNbInstances = B::_mNbInstances + 1;
  shared_ptr<A>::shared_ptr(&abPtr,pAVar2);
  a2Ptr.super_shared_ptr_base.pn.pn._0_1_ = 1;
  testing::internal::CmpHelperEQ<bool,shared_ptr<A>>
            ((internal *)&bPtr,"true","abPtr",(bool *)&a2Ptr,&abPtr);
  if ((char)bPtr.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&a2Ptr);
    if (bPtr.px == (B *)0x0) {
      pp_Var3 = (_func_int **)0x16a6ae;
    }
    else {
      pp_Var3 = ((bPtr.px)->super_A)._vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x220,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18,(Message *)&a2Ptr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&a2Ptr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&bPtr.px);
  a2Ptr.super_shared_ptr_base.pn.pn._0_1_ = 1;
  if (abPtr.super_shared_ptr_base.pn.pn == (long *)0x0) {
    bVar5 = false;
  }
  else {
    bVar5 = *(long *)abPtr.super_shared_ptr_base.pn.pn == 1;
  }
  gtest_ar_18.success_ = bVar5;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&bPtr,"true","abPtr.unique()",(bool *)&a2Ptr,&gtest_ar_18.success_);
  if ((char)bPtr.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&a2Ptr);
    if (bPtr.px == (B *)0x0) {
      pp_Var3 = (_func_int **)0x16a6ae;
    }
    else {
      pp_Var3 = ((bPtr.px)->super_A)._vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x221,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18,(Message *)&a2Ptr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&a2Ptr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&bPtr.px);
  gtest_ar_18._0_4_ = 1;
  if (abPtr.super_shared_ptr_base.pn.pn == (long *)0x0) {
    a2Ptr.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  }
  else {
    a2Ptr.super_shared_ptr_base.pn.pn = *(shared_ptr_count *)abPtr.super_shared_ptr_base.pn.pn;
  }
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&bPtr,"1","abPtr.use_count()",(int *)&gtest_ar_18,(long *)&a2Ptr);
  if ((char)bPtr.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&a2Ptr);
    if (bPtr.px == (B *)0x0) {
      pp_Var3 = (_func_int **)0x16a6ae;
    }
    else {
      pp_Var3 = ((bPtr.px)->super_A)._vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x222,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18,(Message *)&a2Ptr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&a2Ptr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&bPtr.px);
  a2Ptr.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  gtest_ar_18._0_8_ = abPtr.px;
  testing::internal::CmpHelperNE<void*,A*>
            ((internal *)&bPtr,"(void*)__null","abPtr.get()",(void **)&a2Ptr,(A **)&gtest_ar_18);
  if ((char)bPtr.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&a2Ptr);
    if (bPtr.px == (B *)0x0) {
      pp_Var3 = (_func_int **)0x16a6ae;
    }
    else {
      pp_Var3 = ((bPtr.px)->super_A)._vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x223,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18,(Message *)&a2Ptr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&a2Ptr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&bPtr.px);
  a2Ptr.super_shared_ptr_base.pn.pn._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&bPtr,"2","A::_mNbInstances",(int *)&a2Ptr,&A::_mNbInstances);
  if ((char)bPtr.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&a2Ptr);
    if (bPtr.px == (B *)0x0) {
      pp_Var3 = (_func_int **)0x16a6ae;
    }
    else {
      pp_Var3 = ((bPtr.px)->super_A)._vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x224,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18,(Message *)&a2Ptr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&a2Ptr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&bPtr.px);
  a2Ptr.super_shared_ptr_base.pn.pn._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&bPtr,"1","B::_mNbInstances",(int *)&a2Ptr,&B::_mNbInstances);
  if ((char)bPtr.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&a2Ptr);
    if (bPtr.px == (B *)0x0) {
      pp_Var3 = (_func_int **)0x16a6ae;
    }
    else {
      pp_Var3 = ((bPtr.px)->super_A)._vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x225,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18,(Message *)&a2Ptr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&a2Ptr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&bPtr.px);
  p = (B *)operator_new(8);
  A::_mNbInstances = A::_mNbInstances + 1;
  (p->super_A)._vptr_A = (_func_int **)&PTR__B_00183f08;
  B::_mNbInstances = B::_mNbInstances + 1;
  shared_ptr<B>::shared_ptr(&bPtr,p);
  gtest_ar_18.success_ = true;
  testing::internal::CmpHelperEQ<bool,shared_ptr<B>>
            ((internal *)&a2Ptr,"true","bPtr",&gtest_ar_18.success_,&bPtr);
  if ((char)a2Ptr.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&gtest_ar_18);
    if (a2Ptr.px == (A *)0x0) {
      pp_Var3 = (_func_int **)0x16a6ae;
    }
    else {
      pp_Var3 = (a2Ptr.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x228,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&gtest_ar_18);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_18);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&a2Ptr.px);
  gtest_ar_18.success_ = true;
  if (bPtr.super_shared_ptr_base.pn.pn == (long *)0x0) {
    bVar5 = false;
  }
  else {
    bVar5 = *(long *)bPtr.super_shared_ptr_base.pn.pn == 1;
  }
  local_70.data_._0_1_ = bVar5;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&a2Ptr,"true","bPtr.unique()",&gtest_ar_18.success_,(bool *)&local_70);
  if ((char)a2Ptr.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&gtest_ar_18);
    if (a2Ptr.px == (A *)0x0) {
      pp_Var3 = (_func_int **)0x16a6ae;
    }
    else {
      pp_Var3 = (a2Ptr.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x229,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&gtest_ar_18);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_18);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&a2Ptr.px);
  local_70.data_._0_4_ = 1;
  if (bPtr.super_shared_ptr_base.pn.pn == (long *)0x0) {
    gtest_ar_18.success_ = false;
    gtest_ar_18._1_7_ = 0;
  }
  else {
    gtest_ar_18._0_8_ = *(undefined8 *)bPtr.super_shared_ptr_base.pn.pn;
  }
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&a2Ptr,"1","bPtr.use_count()",(int *)&local_70,(long *)&gtest_ar_18);
  if ((char)a2Ptr.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&gtest_ar_18);
    if (a2Ptr.px == (A *)0x0) {
      pp_Var3 = (_func_int **)0x16a6ae;
    }
    else {
      pp_Var3 = (a2Ptr.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x22a,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&gtest_ar_18);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_18);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&a2Ptr.px);
  gtest_ar_18.success_ = false;
  gtest_ar_18._1_7_ = 0;
  local_70.data_ = (AssertHelperData *)bPtr.px;
  testing::internal::CmpHelperNE<void*,B*>
            ((internal *)&a2Ptr,"(void*)__null","bPtr.get()",(void **)&gtest_ar_18,(B **)&local_70);
  if ((char)a2Ptr.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&gtest_ar_18);
    if (a2Ptr.px == (A *)0x0) {
      pp_Var3 = (_func_int **)0x16a6ae;
    }
    else {
      pp_Var3 = (a2Ptr.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x22b,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&gtest_ar_18);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_18);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&a2Ptr.px);
  gtest_ar_18._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&a2Ptr,"3","A::_mNbInstances",(int *)&gtest_ar_18,&A::_mNbInstances);
  if ((char)a2Ptr.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&gtest_ar_18);
    if (a2Ptr.px == (A *)0x0) {
      pp_Var3 = (_func_int **)0x16a6ae;
    }
    else {
      pp_Var3 = (a2Ptr.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x22c,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&gtest_ar_18);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_18);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&a2Ptr.px);
  gtest_ar_18._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&a2Ptr,"2","B::_mNbInstances",(int *)&gtest_ar_18,&B::_mNbInstances);
  if ((char)a2Ptr.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&gtest_ar_18);
    if (a2Ptr.px == (A *)0x0) {
      pp_Var3 = (_func_int **)0x16a6ae;
    }
    else {
      pp_Var3 = (a2Ptr.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x22d,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&gtest_ar_18);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_18);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&a2Ptr.px);
  static_pointer_cast<A,B>((shared_ptr<B> *)&a2Ptr);
  local_70.data_._0_1_ = 1;
  testing::internal::CmpHelperEQ<bool,shared_ptr<A>>
            ((internal *)&gtest_ar_18,"true","a2Ptr",(bool *)&local_70,&a2Ptr);
  if (gtest_ar_18.success_ == false) {
    testing::Message::Message((Message *)&local_70);
    if (gtest_ar_18.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_18.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x231,pcVar4);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_70);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_18.message_);
  local_70.data_ = local_70.data_ & 0xffffffffffffff00;
  if (a2Ptr.super_shared_ptr_base.pn.pn == (long *)0x0) {
    bVar5 = false;
  }
  else {
    bVar5 = *(long *)a2Ptr.super_shared_ptr_base.pn.pn == 1;
  }
  local_88.data_._0_1_ = bVar5;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar_18,"false","a2Ptr.unique()",(bool *)&local_70,(bool *)&local_88);
  if (gtest_ar_18.success_ == false) {
    testing::Message::Message((Message *)&local_70);
    if (gtest_ar_18.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_18.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x232,pcVar4);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_70);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_18.message_);
  local_88.data_._0_4_ = 2;
  if (a2Ptr.super_shared_ptr_base.pn.pn == (long *)0x0) {
    local_70.data_ = (AssertHelperData *)0x0;
  }
  else {
    local_70.data_ = *(AssertHelperData **)a2Ptr.super_shared_ptr_base.pn.pn;
  }
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar_18,"2","a2Ptr.use_count()",(int *)&local_88,(long *)&local_70);
  if (gtest_ar_18.success_ == false) {
    testing::Message::Message((Message *)&local_70);
    if (gtest_ar_18.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_18.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x233,pcVar4);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_70);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_18.message_);
  local_70.data_ = (AssertHelperData *)0x0;
  local_88.data_ = (AssertHelperData *)a2Ptr.px;
  testing::internal::CmpHelperNE<void*,A*>
            ((internal *)&gtest_ar_18,"(void*)__null","a2Ptr.get()",&local_70.data_,(A **)&local_88)
  ;
  if (gtest_ar_18.success_ == false) {
    testing::Message::Message((Message *)&local_70);
    if (gtest_ar_18.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_18.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x234,pcVar4);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_70);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_18.message_);
  local_70.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_18,"3","A::_mNbInstances",(int *)&local_70,&A::_mNbInstances);
  if (gtest_ar_18.success_ == false) {
    testing::Message::Message((Message *)&local_70);
    if (gtest_ar_18.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_18.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x235,pcVar4);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_70);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_18.message_);
  local_70.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_18,"2","B::_mNbInstances",(int *)&local_70,&B::_mNbInstances);
  if (gtest_ar_18.success_ == false) {
    testing::Message::Message((Message *)&local_70);
    if (gtest_ar_18.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_18.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x236,pcVar4);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_70);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_18.message_);
  shared_ptr<A>::shared_ptr(&local_98,&a2Ptr);
  pAVar2 = local_28.px;
  sVar1.pn.pn = local_28.super_shared_ptr_base.pn.pn;
  local_28.super_shared_ptr_base.pn.pn = local_98.super_shared_ptr_base.pn.pn;
  local_28.px = local_98.px;
  local_98.super_shared_ptr_base.pn.pn = sVar1.pn.pn;
  local_98.px = pAVar2;
  shared_ptr<A>::release(&local_98);
  local_88.data_._0_4_ = 3;
  if (local_28.super_shared_ptr_base.pn.pn == (long *)0x0) {
    local_70.data_ = (AssertHelperData *)0x0;
  }
  else {
    local_70.data_ = *(AssertHelperData **)local_28.super_shared_ptr_base.pn.pn;
  }
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar_18,"3","a0Ptr.use_count()",(int *)&local_88,(long *)&local_70);
  if (gtest_ar_18.success_ == false) {
    testing::Message::Message((Message *)&local_70);
    if (gtest_ar_18.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_18.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x23a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_70);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_18.message_);
  shared_ptr<A>::release(&a2Ptr);
  shared_ptr<B>::release(&bPtr);
  shared_ptr<A>::release(&abPtr);
  shared_ptr<A>::release((shared_ptr<A> *)&gtest_ar);
  abPtr.super_shared_ptr_base.pn.pn._0_1_ = 1;
  testing::internal::CmpHelperEQ<bool,shared_ptr<A>>
            ((internal *)&gtest_ar,"true","a0Ptr",(bool *)&abPtr,&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&abPtr);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&bPtr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x23d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&bPtr,(Message *)&abPtr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bPtr);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&abPtr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  abPtr.super_shared_ptr_base.pn.pn._0_1_ = 1;
  if (local_28.super_shared_ptr_base.pn.pn == (long *)0x0) {
    bVar5 = false;
  }
  else {
    bVar5 = *(long *)local_28.super_shared_ptr_base.pn.pn == 1;
  }
  bPtr.super_shared_ptr_base.pn.pn._0_1_ = bVar5;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar,"true","a0Ptr.unique()",(bool *)&abPtr,(bool *)&bPtr);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&abPtr);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&bPtr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x23e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&bPtr,(Message *)&abPtr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bPtr);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&abPtr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bPtr.super_shared_ptr_base.pn.pn._0_4_ = 1;
  if (local_28.super_shared_ptr_base.pn.pn == (long *)0x0) {
    abPtr.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  }
  else {
    abPtr.super_shared_ptr_base.pn.pn = *(shared_ptr_count *)local_28.super_shared_ptr_base.pn.pn;
  }
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"1","a0Ptr.use_count()",(int *)&bPtr,(long *)&abPtr);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&abPtr);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&bPtr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x23f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&bPtr,(Message *)&abPtr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bPtr);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&abPtr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  abPtr.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  bPtr.super_shared_ptr_base.pn.pn = (shared_ptr_count)(shared_ptr_count)local_28.px;
  testing::internal::CmpHelperNE<void*,A*>
            ((internal *)&gtest_ar,"(void*)__null","a0Ptr.get()",(void **)&abPtr,(A **)&bPtr);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&abPtr);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&bPtr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x240,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&bPtr,(Message *)&abPtr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bPtr);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&abPtr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  abPtr.super_shared_ptr_base.pn.pn._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"1","A::_mNbInstances",(int *)&abPtr,&A::_mNbInstances);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&abPtr);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&bPtr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x241,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&bPtr,(Message *)&abPtr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bPtr);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&abPtr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  abPtr.super_shared_ptr_base.pn.pn._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"1","B::_mNbInstances",(int *)&abPtr,&B::_mNbInstances);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&abPtr);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&bPtr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x242,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&bPtr,(Message *)&abPtr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bPtr);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&abPtr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  shared_ptr<A>::release(&local_28);
  abPtr.super_shared_ptr_base.pn.pn =
       (shared_ptr_count)((ulong)abPtr.super_shared_ptr_base.pn.pn & 0xffffffffffffff00);
  testing::internal::CmpHelperEQ<bool,shared_ptr<A>>
            ((internal *)&gtest_ar,"false","a0Ptr",(bool *)&abPtr,&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&abPtr);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&bPtr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x246,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&bPtr,(Message *)&abPtr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bPtr);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&abPtr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  abPtr.super_shared_ptr_base.pn.pn =
       (shared_ptr_count)((ulong)abPtr.super_shared_ptr_base.pn.pn & 0xffffffffffffff00);
  if (local_28.super_shared_ptr_base.pn.pn == (long *)0x0) {
    bVar5 = false;
  }
  else {
    bVar5 = *(long *)local_28.super_shared_ptr_base.pn.pn == 1;
  }
  bPtr.super_shared_ptr_base.pn.pn._0_1_ = bVar5;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar,"false","a0Ptr.unique()",(bool *)&abPtr,(bool *)&bPtr);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&abPtr);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&bPtr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x247,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&bPtr,(Message *)&abPtr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bPtr);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&abPtr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bPtr.super_shared_ptr_base.pn.pn =
       (shared_ptr_count)((ulong)bPtr.super_shared_ptr_base.pn.pn & 0xffffffff00000000);
  if (local_28.super_shared_ptr_base.pn.pn == (long *)0x0) {
    abPtr.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  }
  else {
    abPtr.super_shared_ptr_base.pn.pn = *(shared_ptr_count *)local_28.super_shared_ptr_base.pn.pn;
  }
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"0","a0Ptr.use_count()",(int *)&bPtr,(long *)&abPtr);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&abPtr);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&bPtr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x248,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&bPtr,(Message *)&abPtr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bPtr);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&abPtr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  abPtr.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  bPtr.super_shared_ptr_base.pn.pn = (shared_ptr_count)(shared_ptr_count)local_28.px;
  testing::internal::CmpHelperEQ<void*,A*>
            ((internal *)&gtest_ar,"(void*)__null","a0Ptr.get()",(void **)&abPtr,(A **)&bPtr);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&abPtr);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&bPtr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x249,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&bPtr,(Message *)&abPtr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bPtr);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&abPtr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  abPtr.super_shared_ptr_base.pn.pn =
       (shared_ptr_count)((ulong)abPtr.super_shared_ptr_base.pn.pn & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"0","A::_mNbInstances",(int *)&abPtr,&A::_mNbInstances);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&abPtr);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&bPtr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x24a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&bPtr,(Message *)&abPtr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bPtr);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&abPtr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  abPtr.super_shared_ptr_base.pn.pn =
       (shared_ptr_count)((ulong)abPtr.super_shared_ptr_base.pn.pn & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"0","B::_mNbInstances",(int *)&abPtr,&B::_mNbInstances);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&abPtr);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&bPtr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x24b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&bPtr,(Message *)&abPtr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bPtr);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&abPtr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  shared_ptr<A>::release(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

TEST(shared_ptr, stat_pointer_cast)
{
   shared_ptr<A> a0Ptr;
   EXPECT_EQ(false, a0Ptr);

   {
      shared_ptr<A> aPtr(new A);
      EXPECT_EQ(true, aPtr);
      EXPECT_EQ(true, aPtr.unique());
      EXPECT_EQ(1, aPtr.use_count());
      EXPECT_NE((void*)NULL, aPtr.get());
      EXPECT_EQ(1, A::_mNbInstances);

      shared_ptr<A> abPtr(new B);
      EXPECT_EQ(true, abPtr);
      EXPECT_EQ(true, abPtr.unique());
      EXPECT_EQ(1, abPtr.use_count());
      EXPECT_NE((void*)NULL, abPtr.get());
      EXPECT_EQ(2, A::_mNbInstances);
      EXPECT_EQ(1, B::_mNbInstances);

      shared_ptr<B> bPtr(new B);
      EXPECT_EQ(true, bPtr);
      EXPECT_EQ(true, bPtr.unique());
      EXPECT_EQ(1, bPtr.use_count());
      EXPECT_NE((void*)NULL, bPtr.get());
      EXPECT_EQ(3, A::_mNbInstances);
      EXPECT_EQ(2, B::_mNbInstances);

      // static cast
      shared_ptr<A> a2Ptr = static_pointer_cast<A>(bPtr);
      EXPECT_EQ(true, a2Ptr);
      EXPECT_EQ(false, a2Ptr.unique());
      EXPECT_EQ(2, a2Ptr.use_count());
      EXPECT_NE((void*)NULL, a2Ptr.get());
      EXPECT_EQ(3, A::_mNbInstances);
      EXPECT_EQ(2, B::_mNbInstances);

      // memorize a2Ptr
      a0Ptr = a2Ptr;
      EXPECT_EQ(3, a0Ptr.use_count());
   }
   // after release of the aPtr and bPtr : only abPtr converted to a2Ptr survived through a0Ptr
   EXPECT_EQ(true, a0Ptr);
   EXPECT_EQ(true, a0Ptr.unique());
   EXPECT_EQ(1, a0Ptr.use_count());
   EXPECT_NE((void*)NULL, a0Ptr.get());
   EXPECT_EQ(1, A::_mNbInstances);
   EXPECT_EQ(1, B::_mNbInstances);

   // release the last one
   a0Ptr.reset();
   EXPECT_EQ(false, a0Ptr);
   EXPECT_EQ(false, a0Ptr.unique());
   EXPECT_EQ(0,     a0Ptr.use_count());
   EXPECT_EQ((void*)NULL,  a0Ptr.get());
   EXPECT_EQ(0,     A::_mNbInstances);
   EXPECT_EQ(0,     B::_mNbInstances);
}